

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O3

uint32 __thiscall
Wasm::WasmSignature::WriteSignatureToString(WasmSignature *this,char16 *out,uint32 maxlen)

{
  uint uVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  Local LVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  char16_t *_Format;
  WCHAR *_Dst;
  uint uVar10;
  size_t _SizeInWords;
  uint32 index;
  ArgSlot index_00;
  ulong _SizeInWords_00;
  
  _SizeInWords_00 = (ulong)maxlen;
  uVar1 = this->m_resultsCount;
  uVar10 = (uint)(1 < uVar1) * 8 + 0xc;
  if (maxlen <= uVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0xf4,"(maxlen > minEnd)","maxlen > minEnd");
    if (!bVar4) goto LAB_00f270f5;
    *puVar8 = 0;
  }
  if (out == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmSignature.cpp"
                       ,0xf5,"(out != nullptr)","out != nullptr");
    if (!bVar4) {
LAB_00f270f5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
    uVar5 = _snwprintf_unsafe((WCHAR *)0x0,_SizeInWords_00,0xffffffffffffffff,L"(");
  }
  else {
    uVar5 = _snwprintf_unsafe(out,_SizeInWords_00,0xffffffffffffffff,L"(");
  }
  if (this->m_paramsCount != 0) {
    index_00 = 0;
    do {
      if (index_00 != 0) {
        iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L", ");
        uVar5 = uVar5 + iVar6;
      }
      LVar7 = GetParam(this,index_00);
      pcVar9 = WasmTypes::GetTypeName(LVar7);
      iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L"%ls",pcVar9
                               );
      uVar5 = iVar6 + uVar5;
      index_00 = index_00 + 1;
    } while (index_00 < this->m_paramsCount);
  }
  if (uVar5 < maxlen - uVar10) {
LAB_00f26f92:
    _Dst = out + uVar5;
    _SizeInWords = (size_t)(maxlen - uVar5);
    if (this->m_resultsCount != 1) {
      if (this->m_resultsCount != 0) {
        iVar6 = _snwprintf_unsafe(_Dst,_SizeInWords,0xffffffffffffffff,L")->(");
        uVar5 = iVar6 + uVar5;
        if (this->m_resultsCount != 0) {
          index = 0;
          do {
            if (index != 0) {
              iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L", "
                                       );
              uVar5 = uVar5 + iVar6;
            }
            LVar7 = GetResult(this,index);
            pcVar9 = WasmTypes::GetTypeName(LVar7);
            iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L"%ls",
                                      pcVar9);
            uVar5 = iVar6 + uVar5;
            index = index + 1;
          } while (index < this->m_resultsCount);
        }
        iVar6 = _snwprintf_unsafe(out + uVar5,(ulong)(maxlen - uVar5),0xffffffffffffffff,L")");
        return iVar6 + uVar5;
      }
      iVar6 = _snwprintf_unsafe(_Dst,_SizeInWords,0xffffffffffffffff,L")->void");
      goto LAB_00f26ff9;
    }
    LVar7 = GetResult(this,0);
    pcVar9 = WasmTypes::GetTypeName(LVar7);
    _Format = L")->%ls";
  }
  else {
    memset((void *)((long)out + (_SizeInWords_00 * 2 - (ulong)(uVar10 * 2 - 8)) + -8),0,
           (ulong)(uVar10 * 2));
    uVar3 = uVar5 - uVar10;
    if (uVar5 < uVar10) {
      uVar3 = 0;
    }
    iVar6 = _snwprintf_unsafe(out + uVar3,(ulong)(maxlen - uVar3),0xffffffffffffffff,L"...");
    uVar5 = iVar6 + uVar3;
    if (uVar1 < 2) goto LAB_00f26f92;
    _Dst = out + uVar5;
    _SizeInWords = (size_t)(maxlen - uVar5);
    LVar7 = GetResult(this,0);
    pcVar9 = WasmTypes::GetTypeName(LVar7);
    _Format = L")->(%s, ...)";
  }
  iVar6 = _snwprintf_unsafe(_Dst,_SizeInWords,0xffffffffffffffff,_Format,pcVar9);
LAB_00f26ff9:
  return iVar6 + uVar5;
}

Assistant:

uint32 WasmSignature::WriteSignatureToString(_Out_writes_(maxlen) char16* out, uint32 maxlen)
{
    bool hasMultiResults = GetResultCount() > 1;
    const uint32 minEnd = GetResultCount() > 1 ? 20 : 12;
    AssertOrFailFast(maxlen > minEnd);
    AssertOrFailFast(out != nullptr);
    uint32 numwritten = 0;
#define WRITE_BUF(msg, ...) numwritten += _snwprintf_s(out+numwritten, maxlen-numwritten, _TRUNCATE, msg, ##__VA_ARGS__);
    WRITE_BUF(_u("("));
    for (Js::ArgSlot i = 0; i < GetParamCount(); i++)
    {
        if (i != 0)
        {
            WRITE_BUF(_u(", "));
        }
        WRITE_BUF(_u("%ls"), WasmTypes::GetTypeName(this->GetParam(i)));
    }
    if (numwritten >= maxlen - minEnd) {
        // null out the last 12 characters so we can properly end it 
        for (uint32 i = 1; i <= minEnd; i++)
        {
            *(out + maxlen - i) = 0;
        }
        if (numwritten < minEnd)
        {
            numwritten = 0;
        }
        else
        {
            numwritten -= minEnd;
        }

        WRITE_BUF(_u("..."));
        if (hasMultiResults)
        {
            // If the signature has multiple results, just print the first one then terminate.
            WRITE_BUF(_u(")->(%s, ...)"), WasmTypes::GetTypeName(this->GetResult(0)));
            return numwritten;
        }
    }
    if (GetResultCount() == 0)
    {
        WRITE_BUF(_u(")->void"));
    }
    else if (GetResultCount() == 1)
    {
        WRITE_BUF(_u(")->%ls"), WasmTypes::GetTypeName(this->GetResult(0)));
    }
    else
    {
        WRITE_BUF(_u(")->("));
        for (uint32 i = 0; i < GetResultCount(); i++)
        {
            if (i != 0)
            {
                WRITE_BUF(_u(", "));
            }
            WRITE_BUF(_u("%ls"), WasmTypes::GetTypeName(this->GetResult(i)));
        }
        WRITE_BUF(_u(")"));
    }
#undef WRITE_BUF
    return numwritten;
}